

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

string * __thiscall
spvtools::utils::CardinalToOrdinal_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,size_t cardinal)

{
  string suffix;
  string local_40;
  
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&suffix);
  ToString<unsigned_long>(&local_40,(unsigned_long)this);
  std::operator+(__return_storage_ptr__,&local_40,&suffix);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CardinalToOrdinal(size_t cardinal) {
  const size_t mod10 = cardinal % 10;
  const size_t mod100 = cardinal % 100;
  std::string suffix;
  if (mod10 == 1 && mod100 != 11)
    suffix = "st";
  else if (mod10 == 2 && mod100 != 12)
    suffix = "nd";
  else if (mod10 == 3 && mod100 != 13)
    suffix = "rd";
  else
    suffix = "th";

  return ToString(cardinal) + suffix;
}